

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiclass.cc
# Opt level: O3

void MULTICLASS::print_label_pred(vw *all,example *ec,uint32_t prediction)

{
  bool holdout_set_off;
  shared_data *this;
  namedlabels *pnVar1;
  pointer psVar2;
  size_t current_pass;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  uint uVar6;
  char *pcVar7;
  string local_70;
  string local_50;
  
  this = all->sd;
  pnVar1 = this->ldict;
  uVar6 = (ec->l).multi.label - 1;
  pcVar3 = (char *)0x0;
  pcVar5 = (char *)0x0;
  if (uVar6 < pnVar1->K) {
    psVar2 = (pnVar1->id2name).super__Vector_base<substring,_std::allocator<substring>_>._M_impl.
             super__Vector_impl_data._M_start;
    pcVar5 = psVar2[uVar6].begin;
    pcVar3 = psVar2[uVar6].end;
  }
  uVar6 = prediction - 1;
  pcVar7 = (char *)0x0;
  pcVar4 = (char *)0x0;
  if (uVar6 < pnVar1->K) {
    psVar2 = (pnVar1->id2name).super__Vector_base<substring,_std::allocator<substring>_>._M_impl.
             super__Vector_impl_data._M_start;
    pcVar4 = psVar2[uVar6].begin;
    pcVar7 = psVar2[uVar6].end;
  }
  holdout_set_off = all->holdout_set_off;
  current_pass = all->current_pass;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  if (pcVar5 == (char *)0x0) {
    pcVar5 = "unknown";
    pcVar3 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,pcVar5,pcVar3);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  if (pcVar4 == (char *)0x0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"unknown","");
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,pcVar4,pcVar7);
  }
  shared_data::print_update
            (this,holdout_set_off,current_pass,&local_50,&local_70,ec->num_features,
             all->progress_add,all->progress_arg);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return;
}

Assistant:

void print_label_pred(vw& all, example& ec, uint32_t prediction)
{
  substring ss_label = all.sd->ldict->get(ec.l.multi.label);
  substring ss_pred = all.sd->ldict->get(prediction);
  all.sd->print_update(all.holdout_set_off, all.current_pass,
      !ss_label.begin ? "unknown" : string(ss_label.begin, ss_label.end - ss_label.begin),
      !ss_pred.begin ? "unknown" : string(ss_pred.begin, ss_pred.end - ss_pred.begin), ec.num_features,
      all.progress_add, all.progress_arg);
}